

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patternprops.cpp
# Opt level: O2

UChar * icu_63::PatternProps::skipIdentifier(UChar *s,int32_t length)

{
  UBool UVar1;
  
  while( true ) {
    if (length < 1) {
      return s;
    }
    UVar1 = isSyntaxOrWhiteSpace((uint)(ushort)*s);
    if (UVar1 != '\0') break;
    s = s + 1;
    length = length + -1;
  }
  return s;
}

Assistant:

const UChar *
PatternProps::skipIdentifier(const UChar *s, int32_t length) {
    while(length>0 && !isSyntaxOrWhiteSpace(*s)) {
        ++s;
        --length;
    }
    return s;
}